

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O3

bool __thiscall CsvModelSerialiser::loadModel(CsvModelSerialiser *this,QIODevice *source)

{
  CsvModelSerialiserPrivate *this_00;
  char cVar1;
  bool bVar2;
  QTextStream reader;
  QTextStream aQStack_28 [16];
  
  if (((source != (QIODevice *)0x0) &&
      (((cVar1 = QIODevice::isOpen(), cVar1 != '\0' ||
        (cVar1 = (**(code **)(*(long *)source + 0x68))(source,0x11), cVar1 != '\0')) &&
       (cVar1 = QIODevice::isReadable(), cVar1 != '\0')))) &&
     (this_00 = (CsvModelSerialiserPrivate *)
                (this->super_AbstractSingleRoleSerialiser).super_AbstractStringSerialiser.
                super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate.
     super_AbstractModelSerialiserPrivate.m_model != (QAbstractItemModel *)0x0)) {
    QIODevice::setTextModeEnabled(SUB81(source,0));
    QTextStream::QTextStream(aQStack_28,source);
    bVar2 = CsvModelSerialiserPrivate::readCsv(this_00,aQStack_28);
    QTextStream::~QTextStream(aQStack_28);
    return bVar2;
  }
  return false;
}

Assistant:

bool CsvModelSerialiser::loadModel(QIODevice *source)
{
    if (!source)
        return false;
    if (!source->isOpen()) {
        if (!source->open(QIODevice::ReadOnly | QIODevice::Text))
            return false;
    }
    if (!source->isReadable())
        return false;
    Q_D(CsvModelSerialiser);

    if (!d->m_model)
        return false;
    source->setTextModeEnabled(true);
    QTextStream reader(source);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    return d->readCsv(reader);
}